

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVIMaker.cpp
# Opt level: O3

VideoStream * __thiscall AVIMaker::getVideoStreamByID(AVIMaker *this,uint32_t stream_id)

{
  pointer ppVVar1;
  VideoStream *pVVar2;
  long lVar3;
  long lVar4;
  
  ppVVar1 = (this->videoStreams).super__Vector_base<VideoStream_*,_std::allocator<VideoStream_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->videoStreams).
                super__Vector_base<VideoStream_*,_std::allocator<VideoStream_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppVVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 3;
    lVar4 = 0;
    do {
      pVVar2 = ppVVar1[lVar4];
      if (pVVar2->m_streamID == (ulong)stream_id) {
        return pVVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  if (this->isTrace == true) {
    printf("getVideoStreamByID failed. id = %d");
  }
  return (VideoStream *)0x0;
}

Assistant:

VideoStream *AVIMaker::getVideoStreamByID(uint32_t stream_id) {
    for (int i = 0; i < this->videoStreams.size(); i++) {
        if (this->videoStreams[i]->getStreamID() == stream_id) return this->videoStreams[i];
    }
    TRACE printf("getVideoStreamByID failed. id = %d", stream_id);
    return nullptr;
}